

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int luv_udp_set_membership(lua_State *L)

{
  uv_membership membership_00;
  int status;
  uv_udp_t *handle_00;
  char *multicast_addr_00;
  char *interface_addr_00;
  int ret;
  uv_membership membership;
  char *interface_addr;
  char *multicast_addr;
  uv_udp_t *handle;
  lua_State *L_local;
  
  handle_00 = luv_check_udp(L,1);
  multicast_addr_00 = luaL_checklstring(L,2,(size_t *)0x0);
  interface_addr_00 = luaL_checklstring(L,3,(size_t *)0x0);
  membership_00 = luaL_checkoption(L,4,(char *)0x0,luv_membership_opts);
  status = uv_udp_set_membership(handle_00,multicast_addr_00,interface_addr_00,membership_00);
  if (status < 0) {
    L_local._4_4_ = luv_error(L,status);
  }
  else {
    lua_pushinteger(L,(long)status);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_udp_set_membership(lua_State* L) {
  uv_udp_t* handle = luv_check_udp(L, 1);
  const char* multicast_addr = luaL_checkstring(L, 2);
  const char* interface_addr = luaL_checkstring(L, 3);
  uv_membership membership = (uv_membership)luaL_checkoption(L, 4, NULL, luv_membership_opts);
  int ret = uv_udp_set_membership(handle, multicast_addr, interface_addr, membership);
  return luv_result(L, ret);
}